

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

ArrayXZ * __thiscall
IMLE<1,_1,_FastLinearExpert>::getMultiplePredictionsJacobian(IMLE<1,_1,_FastLinearExpert> *this)

{
  Mat *this_00;
  double dVar1;
  pointer pMVar2;
  pointer pFVar3;
  pointer pMVar4;
  ulong uVar5;
  int j;
  long lVar6;
  RhsNested pMVar7;
  int k;
  long lVar8;
  Mat weightedKappa;
  undefined1 local_1d8 [16];
  long local_1c8;
  Mat *local_1c0;
  Mat *local_1b8;
  scalar_constant_op<double> local_1b0;
  RhsNested local_1a8;
  double *local_1a0;
  long local_198;
  double *local_190;
  scalar_constant_op<double> local_188;
  RhsNested local_180;
  Mat *local_178;
  long local_170;
  RhsNested local_168;
  variable_if_dynamic<long,__1> local_160;
  double *local_158;
  XprTypeNested local_150;
  variable_if_dynamic<long,__1> local_140;
  Index local_138;
  RhsNested local_130;
  XprTypeNested local_128;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_110;
  pointer local_d8 [2];
  undefined8 local_c8;
  long local_c0;
  undefined8 local_b8;
  long local_b0;
  double local_90;
  long local_88;
  double *local_70;
  Index local_68;
  Mat *local_58;
  undefined8 local_50;
  long local_48;
  Index local_40;
  
  if (this->hasPredJacobian == false) {
    pMVar2 = (this->predictionsJacobian).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->predictionsJacobian).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pMVar2) {
      (this->predictionsJacobian).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
    }
    pMVar2 = (this->predictionsVarJacobian).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->predictionsVarJacobian).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pMVar2) {
      (this->predictionsVarJacobian).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
    }
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize(&this->predictionsJacobian,(long)this->nSolFound,&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize(&this->predictionsVarJacobian,(long)this->nSolFound,&this->zeroXZ);
    this_00 = &this->zeta;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,1,
               (long)this->M);
    local_1d8._8_8_ = SEXT48(this->nSolFound);
    local_1d8._0_8_ = (double *)0x1;
    local_1c8 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&weightedKappa,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_1d8);
    lVar8 = 0x110;
    for (lVar6 = 0; uVar5 = (ulong)this->M, lVar6 < (long)uVar5; lVar6 = lVar6 + 1) {
      pFVar3 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c8 = *(undefined8 *)((long)&(pFVar3->super_LinearExpert<1,_1>).Nu + lVar8 + -0x60);
      local_c0 = (long)&(pFVar3->super_LinearExpert<1,_1>).Nu + lVar8;
      local_1b0.m_other =
           (double)(long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6];
      local_1d8._0_8_ =
           weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * (long)local_1b0.m_other;
      local_1d8._8_8_ =
           weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_1c0 = &weightedKappa;
      local_1b8 = (Mat *)0x0;
      local_1a8 = (RhsNested)
                  weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)
                 local_1d8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)local_d8);
      lVar8 = lVar8 + 0x1a8;
    }
    lVar6 = 0x110;
    lVar8 = 0;
    for (pMVar7 = (RhsNested)0x0; (long)pMVar7 < (long)(int)uVar5;
        pMVar7 = (RhsNested)
                 ((long)(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                        m_storage.m_data.array + 1)) {
      pFVar3 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (long)&(pFVar3->super_LinearExpert<1,_1>).Nu + lVar6 + -0x18;
      local_88 = (long)&(pFVar3->super_LinearExpert<1,_1>).Nu + lVar6;
      local_b8 = *(undefined8 *)((long)&(pFVar3->super_LinearExpert<1,_1>).Nu + lVar6 + -0x60);
      local_48 = (long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pMVar7];
      local_90 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[local_48];
      local_70 = weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                 weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * local_48;
      local_68 = weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
      local_58 = &weightedKappa;
      local_50 = 0;
      local_40 = weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)local_1d8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                   *)local_d8,
                  (double *)
                  ((long)(this->varPhiAuxj).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data + lVar8));
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_110.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_rows.m_value * (long)pMVar7;
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow
      .m_value = 0;
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           this_00;
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol
      .m_value = (long)pMVar7;
      local_110.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_110.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
                (&local_110,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)local_1d8);
      local_1c8 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      local_1d8._8_8_ =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_1c8 * (long)pMVar7;
      local_188.m_other =
           (double)(this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_190 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + (long)local_188.m_other * (long)pMVar7;
      local_150 = (XprTypeNested)
                  (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      local_158 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + (long)local_150 * (long)pMVar7;
      local_198 = (long)(this->experts).
                        super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                        .
                        super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x100;
      local_1b0.m_other = 0.0;
      local_170 = 0;
      local_138 = 0;
      local_d8[0] = (this->predictionsJacobian).
                    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)pMVar7];
      local_1b8 = &this->fInvRj;
      local_1a8 = pMVar7;
      local_1a0 = (double *)local_1c8;
      local_178 = &this->invRxj;
      local_168 = pMVar7;
      local_160.m_value = (long)local_188.m_other;
      local_140.m_value = (long)this_00;
      local_130 = pMVar7;
      local_128 = local_150;
      Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase> *)local_d8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>_>
                  *)local_1d8);
      local_1d8._8_8_ =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
      local_1d8._0_8_ =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_1d8._8_8_ * (long)pMVar7;
      local_198 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      local_1a0 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + local_198 * (long)pMVar7;
      local_1b8 = (Mat *)0x0;
      local_180 = (RhsNested)0x0;
      local_d8[0] = (this->predictionsVarJacobian).
                    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)pMVar7];
      local_1c0 = &this->fInvRj;
      local_1b0.m_other = (double)pMVar7;
      local_1a8 = (RhsNested)local_1d8._8_8_;
      local_188.m_other = (double)this_00;
      local_178 = (Mat *)pMVar7;
      local_170 = local_198;
      Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase> *)local_d8,
                 (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                  *)local_1d8);
      uVar5 = (ulong)(uint)this->M;
      lVar6 = lVar6 + 0x1a8;
      lVar8 = lVar8 + 8;
    }
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < this->nSolFound; lVar8 = lVar8 + 1) {
      dVar1 = *(double *)
               ((long)(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data + lVar6);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        local_1d8._0_8_ =
             (long)&(((this->predictions).
                      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage + lVar6;
        local_1d8._8_8_ =
             (long)&(((this->predictionsVarJacobian).
                      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage + lVar6;
        local_d8[0] = (pointer)((long)&(((this->predictionsJacobian).
                                         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                         .
                                         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
                                       .m_storage + lVar6);
        Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase> *)local_d8,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                    *)local_1d8);
        pMVar2 = (this->predictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pMVar4 = (this->predictionsJacobian).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1d8._8_8_ =
             (long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage
             + lVar6;
        *(double *)
         ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
         lVar6) = *(double *)
                   ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                           m_storage + lVar6) *
                  *(double *)
                   ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                           m_storage + lVar6);
        local_1c0 = (Mat *)((long)&(((this->predictionsVarJacobian).
                                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                     .
                                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                                   m_storage + lVar6);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>,Eigen::Matrix<double,1,1,0,1,1>,1>>
                  ((Matrix<double,_1,_1,_0,_1,_1> *)local_1c0,
                   (Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>
                    *)local_1d8);
      }
      else {
        *(double *)
         ((long)&(((this->predictionsJacobian).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage + lVar6) =
             (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
             m_data.array[0];
        *(double *)
         ((long)&(((this->predictionsVarJacobian).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage + lVar6) =
             (this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
             m_storage.m_data.array[0];
      }
      lVar6 = lVar6 + 8;
    }
    this->hasPredJacobian = true;
    free(weightedKappa.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
  }
  return &this->predictionsJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}